

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O3

ssize_t tnt_io_sendv_raw(tnt_stream_net *s,iovec *iov,int count,int all)

{
  tnt_iob_txv_t p_Var1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  if (count < 1) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    do {
      p_Var1 = (s->sbuf).txv;
      if (p_Var1 == (tnt_iob_txv_t)0x0) {
        while (uVar5 = writev(s->fd,(iovec *)iov,count), uVar5 == 0xffffffffffffffff) {
          piVar6 = __errno_location();
          if (*piVar6 != 4) goto LAB_00108a3e;
        }
      }
      else {
        if (getiovmax::iovmax == -1) {
          lVar4 = sysconf(0x3c);
          getiovmax::iovmax = (int)lVar4;
          if (getiovmax::iovmax == -1) {
            getiovmax::iovmax = 1;
          }
        }
        iVar7 = count;
        if ((getiovmax::iovmax <= count) && (iVar7 = getiovmax::iovmax, getiovmax::iovmax == -1)) {
          lVar4 = sysconf(0x3c);
          getiovmax::iovmax = (int)lVar4;
          iVar7 = getiovmax::iovmax;
          if (getiovmax::iovmax == -1) {
            getiovmax::iovmax = 1;
            iVar7 = getiovmax::iovmax;
          }
        }
        uVar5 = (*p_Var1)(&s->sbuf,iov,iVar7);
      }
      if ((long)uVar5 < 1) {
        piVar6 = __errno_location();
LAB_00108a3e:
        s->error = TNT_ESYSTEM;
        s->errno_ = *piVar6;
        return -1;
      }
      lVar9 = lVar9 + uVar5;
      if (all == 0) {
        return lVar9;
      }
      iVar7 = 1;
      if (count < 1) {
        iVar7 = count;
      }
      iVar8 = count;
      do {
        uVar2 = ((iovec *)iov)->iov_len;
        if (uVar5 <= uVar2 && uVar2 - uVar5 != 0) {
          ((iovec *)iov)->iov_base = (void *)((long)((iovec *)iov)->iov_base + uVar5);
          ((iovec *)iov)->iov_len = uVar2 - uVar5;
          count = iVar8;
          break;
        }
        uVar5 = uVar5 - uVar2;
        iov = (iovec *)((iovec *)iov + 1);
        bVar3 = 1 < iVar8;
        iVar8 = iVar8 + -1;
        count = iVar7 + -1;
      } while (bVar3);
    } while (0 < count);
  }
  return lVar9;
}

Assistant:

ssize_t
tnt_io_sendv_raw(struct tnt_stream_net *s, struct iovec *iov, int count, int all)
{
	size_t total = 0;
	while (count > 0) {
		ssize_t r;
		if (s->sbuf.txv) {
			r = s->sbuf.txv(&s->sbuf, iov, MIN(count, getiovmax()));
		} else {
			do {
				r = writev(s->fd, iov, count);
			} while (r == -1 && (errno == EINTR));
		}
		if (r <= 0) {
			s->error = TNT_ESYSTEM;
			s->errno_ = errno;
			return -1;
		}
		total += r;
		if (!all)
			break;
		while (count > 0) {
			if (iov->iov_len > (size_t)r) {
				iov->iov_base += r;
				iov->iov_len -= r;
				break;
			} else {
				r -= iov->iov_len;
				iov++;
				count--;
			}
		}
	}
	return total;
}